

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<long_double>::make_l2_norm
          (default_cost_type<long_double> *this,int n)

{
  longdouble lVar1;
  bool bVar2;
  type plVar3;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  longdouble div;
  int n_local;
  default_cost_type<long_double> *this_local;
  
  _i_1 = (longdouble)0;
  for (local_2c = 0; local_2c != n; local_2c = local_2c + 1) {
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&this->linear_elements,(long)local_2c);
    lVar1 = *plVar3;
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&this->linear_elements,(long)local_2c);
    _i_1 = lVar1 * *plVar3 + _i_1;
  }
  bVar2 = std::isnormal(_i_1);
  if (bVar2) {
    for (local_30 = 0; local_30 != n; local_30 = local_30 + 1) {
      plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->linear_elements,(long)local_30);
      *plVar3 = *plVar3 / _i_1;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }